

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::~IfcCovering(IfcCovering *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x844470;
  *(undefined8 *)&this->field_0x180 = 0x844588;
  *(undefined8 *)&this->field_0x88 = 0x844498;
  *(undefined8 *)&this->field_0x98 = 0x8444c0;
  *(undefined8 *)&this->field_0xd0 = 0x8444e8;
  *(undefined8 *)&this->field_0x100 = 0x844510;
  *(undefined8 *)&this->field_0x138 = 0x844538;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x844560;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__008445a8);
  operator_delete(this,0x198);
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}